

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.c
# Opt level: O0

void assert_string_equal_(char *file,int line,char *expression,char *tried,char *expected)

{
  _func_void_TestReporter_ptr_char_ptr_int_int_char_ptr_varargs *p_Var1;
  _Bool _Var2;
  TestReporter *pTVar3;
  char *pcVar4;
  char *pcVar5;
  char *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  char *in_RDI;
  char *in_R8;
  char *in_stack_ffffffffffffff98;
  
  pTVar3 = get_test_reporter();
  p_Var1 = pTVar3->assert_true;
  pTVar3 = get_test_reporter();
  _Var2 = strings_are_equal(in_stack_ffffffffffffff98,(char *)0x1074a5);
  pcVar4 = show_null_as_the_string_null(in_R8);
  pcVar5 = show_null_as_the_string_null(in_RCX);
  (*p_Var1)(pTVar3,in_RDI,in_ESI,(uint)_Var2,"[%s] should be [%s] but was [%s]\n",in_RDX,pcVar4,
            pcVar5);
  return;
}

Assistant:

void assert_string_equal_(const char *file, int line, const char *expression, const char *tried, const char *expected) {
    (*get_test_reporter()->assert_true)(
            get_test_reporter(),
            file,
            line,
            strings_are_equal(tried, expected),
            "[%s] should be [%s] but was [%s]\n", expression, show_null_as_the_string_null(expected), show_null_as_the_string_null(tried));
}